

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TextureMipmapTests::init(TextureMipmapTests *this,EVP_PKEY_CTX *ctx)

{
  CoordType CVar1;
  deUint32 wrapS;
  TestContext *pTVar2;
  char *pcVar3;
  Context *pCVar4;
  RenderContext *pRVar5;
  ContextInfo *renderCtxInfo;
  TestNode *pTVar6;
  TestNode *pTVar7;
  TestNode *node;
  TestNode *pTVar8;
  ostream *poVar9;
  Texture2DMipmapCase *pTVar10;
  long lVar11;
  long lVar12;
  Texture2DGenMipmapCase *this_00;
  TestNode *pTVar13;
  TextureCubeMipmapCase *this_01;
  TextureCubeGenMipmapCase *this_02;
  Texture3DMipmapCase *pTVar14;
  undefined8 extraout_RAX;
  undefined8 uVar15;
  undefined8 extraout_RAX_00;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  char *local_1d8 [4];
  long local_1b8;
  long local_1b0;
  ostringstream name;
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Mipmapping");
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Mipmapping");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"3d",
             "3D Texture Mipmapping");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  tcu::TestNode::addChild((TestNode *)this,node);
  lVar12 = 0;
  while( true ) {
    pTVar8 = (TestNode *)operator_new(0x70);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar12 == 3) break;
    local_1b8 = lVar12;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar2,init::coordTypes[lVar12].name,
               init::coordTypes[lVar12].desc);
    tcu::TestNode::addChild(pTVar6,pTVar8);
    CVar1 = init::coordTypes[lVar12].type;
    lVar12 = 0;
    while (lVar12 != 4) {
      local_1b0 = lVar12;
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        for (uVar18 = 0; ((ulong)(CVar1 == COORDTYPE_BASIC) << 5 | 0x10) != uVar18;
            uVar18 = uVar18 + 0x10) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          poVar9 = std::operator<<((ostream *)&name,init::minFilterModes[lVar12].name);
          poVar9 = std::operator<<(poVar9,"_");
          std::operator<<(poVar9,init::wrapModes[lVar11].name);
          pcVar3 = *(char **)((long)&init::tex2DSizes[0].name + uVar18);
          if (pcVar3 != (char *)0x0) {
            poVar9 = std::operator<<((ostream *)&name,"_");
            std::operator<<(poVar9,pcVar3);
          }
          pTVar10 = (Texture2DMipmapCase *)operator_new(0x100);
          pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          pCVar4 = (this->super_TestCaseGroup).m_context;
          pRVar5 = pCVar4->m_renderCtx;
          renderCtxInfo = pCVar4->m_contextInfo;
          std::__cxx11::stringbuf::str();
          Texture2DMipmapCase::Texture2DMipmapCase
                    (pTVar10,pTVar2,pRVar5,renderCtxInfo,local_1d8[0],"",CVar1,
                     init::minFilterModes[lVar12].mode,init::wrapModes[lVar11].mode,
                     init::wrapModes[lVar11].mode,0x1908,0x1401,
                     *(int *)((long)&init::tex2DSizes[0].width + uVar18),
                     *(int *)((long)&init::tex2DSizes[0].height + uVar18));
          tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar10);
          std::__cxx11::string::~string((string *)local_1d8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        }
      }
      lVar12 = local_1b0 + 1;
    }
    lVar12 = local_1b8 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,pTVar2,"bias","User-supplied bias value");
  tcu::TestNode::addChild(pTVar6,pTVar8);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar10 = (Texture2DMipmapCase *)operator_new(0x100);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    Texture2DMipmapCase::Texture2DMipmapCase
              (pTVar10,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               pCVar4->m_renderCtx,pCVar4->m_contextInfo,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",COORDTYPE_BASIC_BIAS,
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12),0x2901,0x2901,0x1908,
               0x1401,0x40,0x40);
    tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar10);
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"generate",
             "Mipmap generation tests");
  tcu::TestNode::addChild(pTVar6,pTVar8);
  for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      for (lVar19 = 0; lVar19 != 0x20; lVar19 = lVar19 + 0x10) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        std::operator<<((ostream *)&name,init::formats[lVar12].name);
        pcVar3 = init::tex2DSizes[lVar11].name;
        if (pcVar3 != (char *)0x0) {
          poVar9 = std::operator<<((ostream *)&name,"_");
          std::operator<<(poVar9,pcVar3);
        }
        poVar9 = std::operator<<((ostream *)&name,"_");
        std::operator<<(poVar9,*(char **)((long)&init::genHints[0].name + lVar19));
        this_00 = (Texture2DGenMipmapCase *)operator_new(0xf0);
        pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar5 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
        std::__cxx11::stringbuf::str();
        Texture2DGenMipmapCase::Texture2DGenMipmapCase
                  (this_00,pTVar2,pRVar5,local_1d8[0],"",init::formats[lVar12].format,
                   init::formats[lVar12].dataType,
                   *(deUint32 *)((long)&init::genHints[0].hint + lVar19),
                   init::tex2DSizes[lVar11].width,init::tex2DSizes[lVar11].height);
        tcu::TestNode::addChild(pTVar8,(TestNode *)this_00);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      }
    }
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"min_lod",
             "Lod control: min lod");
  tcu::TestNode::addChild(pTVar6,pTVar8);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar13 = (TestNode *)operator_new(0xe8);
    Texture2DMinLodCase::Texture2DMinLodCase
              ((Texture2DMinLodCase *)pTVar13,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
    tcu::TestNode::addChild(pTVar8,pTVar13);
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"max_lod",
             "Lod control: max lod");
  tcu::TestNode::addChild(pTVar6,pTVar8);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar13 = (TestNode *)operator_new(0xe8);
    Texture2DMaxLodCase::Texture2DMaxLodCase
              ((Texture2DMaxLodCase *)pTVar13,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
    tcu::TestNode::addChild(pTVar8,pTVar13);
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"base_level",
             "Base level");
  tcu::TestNode::addChild(pTVar6,pTVar8);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar13 = (TestNode *)operator_new(0xe8);
    Texture2DBaseLevelCase::Texture2DBaseLevelCase
              ((Texture2DBaseLevelCase *)pTVar13,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
    tcu::TestNode::addChild(pTVar8,pTVar13);
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"max_level",
             "Max level");
  tcu::TestNode::addChild(pTVar6,pTVar8);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar6 = (TestNode *)operator_new(0xe8);
    Texture2DMaxLevelCase::Texture2DMaxLevelCase
              ((Texture2DMaxLevelCase *)pTVar6,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
    tcu::TestNode::addChild(pTVar8,pTVar6);
  }
  lVar12 = 0;
  while( true ) {
    pTVar6 = (TestNode *)operator_new(0x70);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar12 == 3) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,pTVar2,init::cubeCoordTypes[lVar12].name,
               init::cubeCoordTypes[lVar12].desc);
    tcu::TestNode::addChild(pTVar7,pTVar6);
    for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 0x10) {
      this_01 = (TextureCubeMipmapCase *)operator_new(0x100);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      TextureCubeMipmapCase::TextureCubeMipmapCase
                (this_01,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 pCVar4->m_renderCtx,pCVar4->m_contextInfo,
                 *(char **)((long)&init::minFilterModes[0].name + lVar11),"",
                 init::cubeCoordTypes[lVar12].type,
                 *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11),0x812f,0x812f,0x1908,
                 0x1401,0x40);
      tcu::TestNode::addChild(pTVar6,(TestNode *)this_01);
    }
    lVar12 = lVar12 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar2,"generate","Mipmap generation tests");
  tcu::TestNode::addChild(pTVar7,pTVar6);
  for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
    for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 0x10) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      poVar9 = std::operator<<((ostream *)&name,init::formats[lVar12].name);
      poVar9 = std::operator<<(poVar9,"_");
      std::operator<<(poVar9,*(char **)((long)&init::genHints[0].name + lVar11));
      this_02 = (TextureCubeGenMipmapCase *)operator_new(0xe8);
      pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar5 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
      std::__cxx11::stringbuf::str();
      TextureCubeGenMipmapCase::TextureCubeGenMipmapCase
                (this_02,pTVar2,pRVar5,local_1d8[0],"",init::formats[lVar12].format,
                 init::formats[lVar12].dataType,
                 *(deUint32 *)((long)&init::genHints[0].hint + lVar11),0x40);
      tcu::TestNode::addChild(pTVar6,(TestNode *)this_02);
      std::__cxx11::string::~string((string *)local_1d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
    }
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"min_lod",
             "Lod control: min lod");
  tcu::TestNode::addChild(pTVar7,pTVar6);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar8 = (TestNode *)operator_new(0xe0);
    TextureCubeMinLodCase::TextureCubeMinLodCase
              ((TextureCubeMinLodCase *)pTVar8,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
    tcu::TestNode::addChild(pTVar6,pTVar8);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"max_lod",
             "Lod control: max lod");
  tcu::TestNode::addChild(pTVar7,pTVar6);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar8 = (TestNode *)operator_new(0xe0);
    TextureCubeMaxLodCase::TextureCubeMaxLodCase
              ((TextureCubeMaxLodCase *)pTVar8,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
    tcu::TestNode::addChild(pTVar6,pTVar8);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"base_level",
             "Base level");
  tcu::TestNode::addChild(pTVar7,pTVar6);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar8 = (TestNode *)operator_new(0xe0);
    TextureCubeBaseLevelCase::TextureCubeBaseLevelCase
              ((TextureCubeBaseLevelCase *)pTVar8,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
    tcu::TestNode::addChild(pTVar6,pTVar8);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"max_level",
             "Max level");
  tcu::TestNode::addChild(pTVar7,pTVar6);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar7 = (TestNode *)operator_new(0xe0);
    TextureCubeMaxLevelCase::TextureCubeMaxLevelCase
              ((TextureCubeMaxLevelCase *)pTVar7,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
    tcu::TestNode::addChild(pTVar6,pTVar7);
  }
  lVar12 = 0;
  while( true ) {
    pTVar6 = (TestNode *)operator_new(0x70);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar12 == 3) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,pTVar2,init::coordTypes[lVar12].name,
               init::coordTypes[lVar12].desc);
    tcu::TestNode::addChild(node,pTVar6);
    CVar1 = init::coordTypes[lVar12].type;
    lVar11 = 0x18;
    if (CVar1 == COORDTYPE_BASIC) {
      lVar11 = 0x30;
    }
    for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
      for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
        for (lVar17 = 0; lVar11 != lVar17; lVar17 = lVar17 + 0x18) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          poVar9 = std::operator<<((ostream *)&name,init::minFilterModes[lVar19].name);
          poVar9 = std::operator<<(poVar9,"_");
          std::operator<<(poVar9,init::wrapModes[lVar16].name);
          pcVar3 = *(char **)((long)&init::tex3DSizes[0].name + lVar17);
          if (pcVar3 != (char *)0x0) {
            poVar9 = std::operator<<((ostream *)&name,"_");
            std::operator<<(poVar9,pcVar3);
          }
          pTVar14 = (Texture3DMipmapCase *)operator_new(0x100);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::stringbuf::str();
          wrapS = init::wrapModes[lVar16].mode;
          Texture3DMipmapCase::Texture3DMipmapCase
                    (pTVar14,pCVar4,local_1d8[0],"",CVar1,init::minFilterModes[lVar19].mode,wrapS,
                     wrapS,wrapS,0x8058,*(int *)((long)&init::tex3DSizes[0].width + lVar17),
                     *(int *)((long)&init::tex3DSizes[0].height + lVar17),
                     *(int *)((long)&init::tex3DSizes[0].depth + lVar17));
          tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar14);
          std::__cxx11::string::~string((string *)local_1d8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        }
      }
    }
    lVar12 = lVar12 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar2,"bias","User-supplied bias value");
  tcu::TestNode::addChild(node,pTVar6);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar14 = (Texture3DMipmapCase *)operator_new(0x100);
    Texture3DMipmapCase::Texture3DMipmapCase
              (pTVar14,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",COORDTYPE_BASIC_BIAS,
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12),0x2901,0x2901,0x2901,
               0x8058,0x20,0x20,0x20);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar14);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"min_lod",
             "Lod control: min lod");
  tcu::TestNode::addChild(node,pTVar6);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar7 = (TestNode *)operator_new(0xe8);
    Texture3DMinLodCase::Texture3DMinLodCase
              ((Texture3DMinLodCase *)pTVar7,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
    tcu::TestNode::addChild(pTVar6,pTVar7);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"max_lod",
             "Lod control: max lod");
  tcu::TestNode::addChild(node,pTVar6);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar7 = (TestNode *)operator_new(0xe8);
    Texture3DMaxLodCase::Texture3DMaxLodCase
              ((Texture3DMaxLodCase *)pTVar7,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
    tcu::TestNode::addChild(pTVar6,pTVar7);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"base_level",
             "Base level");
  tcu::TestNode::addChild(node,pTVar6);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar7 = (TestNode *)operator_new(0xe8);
    Texture3DBaseLevelCase::Texture3DBaseLevelCase
              ((Texture3DBaseLevelCase *)pTVar7,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
    tcu::TestNode::addChild(pTVar6,pTVar7);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"max_level",
             "Max level");
  tcu::TestNode::addChild(node,pTVar6);
  uVar15 = extraout_RAX;
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar7 = (TestNode *)operator_new(0xe8);
    Texture3DMaxLevelCase::Texture3DMaxLevelCase
              ((Texture3DMaxLevelCase *)pTVar7,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12));
    tcu::TestNode::addChild(pTVar6,pTVar7);
    uVar15 = extraout_RAX_00;
  }
  return (int)uVar15;
}

Assistant:

void TextureMipmapTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Mipmapping");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Mipmapping");
	tcu::TestCaseGroup*	group3D		= new tcu::TestCaseGroup(m_testCtx, "3d",	"3D Texture Mipmapping");
	addChild(group2D);
	addChild(groupCube);
	addChild(group3D);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	static const struct
	{
		const char*		name;
		deUint32		hint;
	} genHints[] =
	{
		{ "fastest",	GL_FASTEST },
		{ "nicest",		GL_NICEST }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} tex2DSizes[] =
	{
		{ DE_NULL,		64, 64 }, // Default.
		{ "npot",		63, 57 },
		{ "non_square",	32, 64 }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
		int				depth;
	} tex3DSizes[] =
	{
		{ DE_NULL,		32, 32, 32 }, // Default.
		{ "npot",		33, 29, 27 }
	};

	const int cubeMapSize = 64;

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			},
		{ COORDTYPE_BASIC_BIAS,	"bias",			"User-supplied bias value"							}
	};

	// 2D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group2D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				// Add non_square variants to basic cases only.
				int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex2DSizes) : 1;

				for (int size = 0; size < sizeEnd; size++)
				{
					std::ostringstream name;
					name << minFilterModes[minFilter].name
						 << "_" << wrapModes[wrapMode].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					coordTypeGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
																	 name.str().c_str(), "",
																	 coordTypes[coordType].type,
																	 minFilterModes[minFilter].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 GL_RGBA, GL_UNSIGNED_BYTE,
																	 tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	// 2D bias variants.
	{
		tcu::TestCaseGroup* biasGroup = new tcu::TestCaseGroup(m_testCtx, "bias", "User-supplied bias value");
		group2D->addChild(biasGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			biasGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														minFilterModes[minFilter].name, "",
														COORDTYPE_BASIC_BIAS,
														minFilterModes[minFilter].mode,
														GL_REPEAT, GL_REPEAT,
														GL_RGBA, GL_UNSIGNED_BYTE,
														tex2DSizes[0].width, tex2DSizes[0].height));
	}

	// 2D mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		group2D->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int size = 0; size < DE_LENGTH_OF_ARRAY(tex2DSizes); size++)
			{
				for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
				{
					std::ostringstream name;
					name << formats[format].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					name << "_" << genHints[hint].name;

					genMipmapGroup->addChild(new Texture2DGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
																		formats[format].format, formats[format].dataType, genHints[hint].hint,
																		tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	// 2D LOD controls.
	{
		// MIN_LOD
		tcu::TestCaseGroup* minLodGroup = new tcu::TestCaseGroup(m_testCtx, "min_lod", "Lod control: min lod");
		group2D->addChild(minLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			minLodGroup->addChild(new Texture2DMinLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LOD
		tcu::TestCaseGroup* maxLodGroup = new tcu::TestCaseGroup(m_testCtx, "max_lod", "Lod control: max lod");
		group2D->addChild(maxLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLodGroup->addChild(new Texture2DMaxLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// BASE_LEVEL
		tcu::TestCaseGroup* baseLevelGroup = new tcu::TestCaseGroup(m_testCtx, "base_level", "Base level");
		group2D->addChild(baseLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			baseLevelGroup->addChild(new Texture2DBaseLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LEVEL
		tcu::TestCaseGroup* maxLevelGroup = new tcu::TestCaseGroup(m_testCtx, "max_level", "Max level");
		group2D->addChild(maxLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLevelGroup->addChild(new Texture2DMaxLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));
	}

	// Cubemap cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc);
		groupCube->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			coordTypeGroup->addChild(new TextureCubeMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															   minFilterModes[minFilter].name, "",
															   cubeCoordTypes[coordType].type,
															   minFilterModes[minFilter].mode,
															   GL_CLAMP_TO_EDGE,
															   GL_CLAMP_TO_EDGE,
															   GL_RGBA, GL_UNSIGNED_BYTE, cubeMapSize));
		}
	}

	// Cubemap mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		groupCube->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
			{
				std::ostringstream name;
				name << formats[format].name
					 << "_" << genHints[hint].name;

				genMipmapGroup->addChild(new TextureCubeGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "", formats[format].format, formats[format].dataType, genHints[hint].hint, cubeMapSize));
			}
		}
	}

	// Cubemap LOD controls.
	{
		// MIN_LOD
		tcu::TestCaseGroup* minLodGroup = new tcu::TestCaseGroup(m_testCtx, "min_lod", "Lod control: min lod");
		groupCube->addChild(minLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			minLodGroup->addChild(new TextureCubeMinLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LOD
		tcu::TestCaseGroup* maxLodGroup = new tcu::TestCaseGroup(m_testCtx, "max_lod", "Lod control: max lod");
		groupCube->addChild(maxLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLodGroup->addChild(new TextureCubeMaxLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// BASE_LEVEL
		tcu::TestCaseGroup* baseLevelGroup = new tcu::TestCaseGroup(m_testCtx, "base_level", "Base level");
		groupCube->addChild(baseLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			baseLevelGroup->addChild(new TextureCubeBaseLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LEVEL
		tcu::TestCaseGroup* maxLevelGroup = new tcu::TestCaseGroup(m_testCtx, "max_level", "Max level");
		groupCube->addChild(maxLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLevelGroup->addChild(new TextureCubeMaxLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));
	}

	// 3D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group3D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				// Add other size variants to basic cases only.
				int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex3DSizes) : 1;

				for (int size = 0; size < sizeEnd; size++)
				{
					std::ostringstream name;
					name << minFilterModes[minFilter].name
						 << "_" << wrapModes[wrapMode].name;

					if (tex3DSizes[size].name)
						name << "_" << tex3DSizes[size].name;

					coordTypeGroup->addChild(new Texture3DMipmapCase(m_context,
																	 name.str().c_str(), "",
																	 coordTypes[coordType].type,
																	 minFilterModes[minFilter].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 GL_RGBA8,
																	 tex3DSizes[size].width, tex3DSizes[size].height, tex3DSizes[size].depth));
				}
			}
		}
	}

	// 3D bias variants.
	{
		tcu::TestCaseGroup* biasGroup = new tcu::TestCaseGroup(m_testCtx, "bias", "User-supplied bias value");
		group3D->addChild(biasGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			biasGroup->addChild(new Texture3DMipmapCase(m_context,
														minFilterModes[minFilter].name, "",
														COORDTYPE_BASIC_BIAS,
														minFilterModes[minFilter].mode,
														GL_REPEAT, GL_REPEAT, GL_REPEAT,
														GL_RGBA8,
														tex3DSizes[0].width, tex3DSizes[0].height, tex3DSizes[0].depth));
	}

	// 3D LOD controls.
	{
		// MIN_LOD
		tcu::TestCaseGroup* minLodGroup = new tcu::TestCaseGroup(m_testCtx, "min_lod", "Lod control: min lod");
		group3D->addChild(minLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			minLodGroup->addChild(new Texture3DMinLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LOD
		tcu::TestCaseGroup* maxLodGroup = new tcu::TestCaseGroup(m_testCtx, "max_lod", "Lod control: max lod");
		group3D->addChild(maxLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLodGroup->addChild(new Texture3DMaxLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// BASE_LEVEL
		tcu::TestCaseGroup* baseLevelGroup = new tcu::TestCaseGroup(m_testCtx, "base_level", "Base level");
		group3D->addChild(baseLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			baseLevelGroup->addChild(new Texture3DBaseLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LEVEL
		tcu::TestCaseGroup* maxLevelGroup = new tcu::TestCaseGroup(m_testCtx, "max_level", "Max level");
		group3D->addChild(maxLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLevelGroup->addChild(new Texture3DMaxLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));
	}
}